

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O3

bool DecodeBase58(string *str,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchRet,
                 int max_ret_len)

{
  char *psz;
  bool bVar1;
  size_type sVar2;
  long in_FS_OFFSET;
  
  psz = (str->_M_dataplus)._M_p;
  if (str->_M_string_length != 0) {
    sVar2 = 0;
    do {
      if (psz[sVar2] == '\0') {
        if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
          return false;
        }
        goto LAB_003e674e;
      }
      sVar2 = sVar2 + 1;
    } while (str->_M_string_length != sVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    bVar1 = DecodeBase58(psz,vchRet,max_ret_len);
    return bVar1;
  }
LAB_003e674e:
  __stack_chk_fail();
}

Assistant:

bool DecodeBase58(const std::string& str, std::vector<unsigned char>& vchRet, int max_ret_len)
{
    if (!ContainsNoNUL(str)) {
        return false;
    }
    return DecodeBase58(str.c_str(), vchRet, max_ret_len);
}